

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseModuleFieldList(WastParser *this,Module *module)

{
  vector<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_> *pvVar1;
  vector<wabt::Expr_*,_std::allocator<wabt::Expr_*>_> *this_00;
  ModuleFieldType MVar2;
  pointer pRVar3;
  ResolveFuncs *__first;
  ResolveFuncs *__last;
  pointer pRVar4;
  pointer pTVar5;
  pointer pTVar6;
  bool bVar7;
  bool bVar8;
  TokenType TVar9;
  TokenType TVar10;
  Result RVar11;
  _Hash_node_base *p_Var12;
  Func *func;
  Errors *errors;
  TokenTypePair pair;
  pointer pRVar13;
  pointer pRVar14;
  _func_int **pp_Var15;
  FuncDeclaration *decl;
  ModuleField *field;
  ModuleField *pMVar16;
  pointer pRVar17;
  ResolveTypes it;
  ResolveFuncTypesExprVisitorDelegate delegate;
  ExprVisitor local_b0;
  Delegate local_48;
  Module *local_40;
  Errors *local_38;
  
  pRVar14 = (this->resolve_types_).
            super__Vector_base<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pRVar3 = (this->resolve_types_).
           super__Vector_base<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pRVar13 = pRVar14;
  if (pRVar3 != pRVar14) {
    do {
      std::vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>::
      ~vector(&pRVar13->vars);
      pRVar13 = pRVar13 + 1;
    } while (pRVar13 != pRVar3);
    (this->resolve_types_).
    super__Vector_base<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar14;
  }
  __first = (this->resolve_funcs_).
            super__Vector_base<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __last = (this->resolve_funcs_).
           super__Vector_base<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__last != __first) {
    std::_Destroy_aux<false>::__destroy<wabt::WastParser::ResolveFuncs*>(__first,__last);
    (this->resolve_funcs_).
    super__Vector_base<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>
    ._M_impl.super__Vector_impl_data._M_finish = __first;
  }
LAB_00139d91:
  do {
    TVar9 = Peek(this,0);
    TVar10 = Peek(this,1);
    pair._M_elems[1] = TVar10;
    pair._M_elems[0] = TVar9;
    bVar7 = anon_unknown_1::IsModuleField(pair);
    if ((!bVar7) && (bVar7 = PeekIsCustom(this), !bVar7)) {
      pRVar14 = (this->resolve_types_).
                super__Vector_base<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pRVar3 = (this->resolve_types_).
               super__Vector_base<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pRVar14 == pRVar3) {
        bVar7 = false;
      }
      else {
        pvVar1 = &local_b0.state_stack_;
        bVar7 = false;
        do {
          local_b0.delegate_ = (Delegate *)pRVar14->target_types;
          std::
          vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>::
          vector((vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
                  *)pvVar1,&pRVar14->vars);
          RVar11 = ResolveRefTypes(module,(TypeVector *)local_b0.delegate_,(ReferenceVars *)pvVar1,
                                   this->errors_);
          bVar7 = (bool)(bVar7 | RVar11.enum_ == Error);
          std::
          vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>::
          ~vector((vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
                   *)pvVar1);
          pRVar14 = pRVar14 + 1;
        } while (pRVar14 != pRVar3);
      }
      pRVar17 = (this->resolve_funcs_).
                super__Vector_base<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pRVar4 = (this->resolve_funcs_).
               super__Vector_base<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pRVar17 != pRVar4) {
        pvVar1 = &local_b0.state_stack_;
        this_00 = &local_b0.expr_stack_;
        do {
          local_b0.delegate_ = (Delegate *)pRVar17->target_func;
          std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                    ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)pvVar1,&pRVar17->types);
          std::
          vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>::
          vector((vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
                  *)this_00,&pRVar17->vars);
          RVar11 = ResolveRefTypes(module,(TypeVector *)pvVar1,(ReferenceVars *)this_00,
                                   this->errors_);
          LocalTypes::Set((LocalTypes *)((long)local_b0.delegate_ + 0xa0),(TypeVector *)pvVar1);
          std::
          vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>::
          ~vector((vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
                   *)this_00);
          if (local_b0.state_stack_.
              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b0.state_stack_.
                            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_b0.state_stack_.
                                  super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b0.state_stack_.
                                  super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          bVar7 = (bool)(bVar7 | RVar11.enum_ == Error);
          pRVar17 = pRVar17 + 1;
        } while (pRVar17 != pRVar4);
      }
      if (bVar7) {
        return (Result)Error;
      }
      errors = this->errors_;
      pMVar16 = (module->fields).first_;
      if (pMVar16 == (ModuleField *)0x0) goto LAB_0013a0ce;
      bVar7 = false;
      do {
        MVar2 = pMVar16->type_;
        if (MVar2 == Tag) {
          decl = (FuncDeclaration *)&pMVar16[1].loc.filename._M_str;
LAB_00139f8d:
          func = (Func *)0x0;
LAB_00139f8f:
          bVar8 = anon_unknown_1::ResolveFuncTypeWithEmptySignature(module,decl);
          anon_unknown_1::ResolveImplicitlyDefinedFunctionType(&pMVar16->loc,module,decl);
          RVar11 = anon_unknown_1::CheckFuncTypeVarMatchesExplicit(&pMVar16->loc,module,decl,errors)
          ;
          bVar7 = RVar11.enum_ == Error || bVar7;
          if (func != (Func *)0x0) {
            if ((bVar8) &&
               (p_Var12 = (func->bindings).
                          super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                          ._M_h._M_before_begin._M_nxt, p_Var12 != (_Hash_node_base *)0x0)) {
              pTVar5 = (func->decl).sig.param_types.
                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              pTVar6 = (func->decl).sig.param_types.
                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                       super__Vector_impl_data._M_start;
              do {
                *(int *)&p_Var12[9]._M_nxt =
                     *(int *)&p_Var12[9]._M_nxt + (int)((ulong)((long)pTVar5 - (long)pTVar6) >> 3);
                p_Var12 = p_Var12->_M_nxt;
              } while (p_Var12 != (_Hash_node_base *)0x0);
            }
            local_48._vptr_Delegate = (_func_int **)&PTR__Delegate_001a3238;
            local_40 = module;
            local_38 = errors;
            ExprVisitor::ExprVisitor(&local_b0,&local_48);
            RVar11 = ExprVisitor::VisitFunc(&local_b0,func);
            if (local_b0.catch_index_stack_.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b0.catch_index_stack_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_b0.catch_index_stack_.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_b0.catch_index_stack_.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_b0.expr_iter_stack_.
                super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b0.expr_iter_stack_.
                              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_b0.expr_iter_stack_.
                                    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_b0.expr_iter_stack_.
                                    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_b0.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b0.expr_stack_.
                              super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_b0.expr_stack_.
                                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_b0.expr_stack_.
                                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_b0.state_stack_.
                super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b0.state_stack_.
                              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_b0.state_stack_.
                                    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_b0.state_stack_.
                                    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            bVar7 = bVar7 || RVar11.enum_ == Error;
          }
        }
        else {
          if (MVar2 == Import) {
            pp_Var15 = pMVar16[1]._vptr_ModuleField;
            if (pp_Var15 == (_func_int **)0x0 || *(int *)(pp_Var15 + 9) != 0) {
              if (*(int *)(pp_Var15 + 9) != 4) {
                pp_Var15 = (_func_int **)0x0;
              }
              if (pp_Var15 == (_func_int **)0x0) goto LAB_0013a0b3;
            }
            decl = (FuncDeclaration *)(pp_Var15 + 0xe);
            goto LAB_00139f8d;
          }
          if (MVar2 == Func) {
            func = (Func *)(pMVar16 + 1);
            decl = (FuncDeclaration *)&pMVar16[1].loc.filename._M_str;
            goto LAB_00139f8f;
          }
        }
LAB_0013a0b3:
        pMVar16 = (pMVar16->super_intrusive_list_base<wabt::ModuleField>).next_;
        if (pMVar16 == (ModuleField *)0x0) {
          if (bVar7) {
            return (Result)Error;
          }
          errors = this->errors_;
LAB_0013a0ce:
          RVar11 = ResolveNamesModule(module,errors);
          return (Result)(uint)(RVar11.enum_ == Error);
        }
      } while( true );
    }
    bVar7 = PeekIsCustom(this);
    if (bVar7) {
      RVar11 = ParseCustomSectionAnnotation(this,module);
    }
    else {
      RVar11 = ParseModuleField(this,module);
      if (RVar11.enum_ != Error) goto LAB_00139d91;
      RVar11 = Synchronize(this,anon_unknown_1::IsModuleField);
    }
    if (RVar11.enum_ == Error) {
      return (Result)Error;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseModuleFieldList(Module* module) {
  WABT_TRACE(ParseModuleFieldList);

  // Reset module-specific state.
  resolve_types_.clear();
  resolve_funcs_.clear();

  while (IsModuleField(PeekPair()) || PeekIsCustom()) {
    if (PeekIsCustom()) {
      CHECK_RESULT(ParseCustomSectionAnnotation(module));
      continue;
    }
    if (Failed(ParseModuleField(module))) {
      CHECK_RESULT(Synchronize(IsModuleField));
    }
  }

  // Module parsing is completed, type names can be resolved now.
  Result result = Result::Ok;

  for (auto it : resolve_types_) {
    result |= ResolveRefTypes(*module, it.target_types, &it.vars, errors_);
  }

  for (auto it : resolve_funcs_) {
    result |= ResolveRefTypes(*module, &it.types, &it.vars, errors_);
    it.target_func->local_types.Set(it.types);
  }

  CHECK_RESULT(result);
  CHECK_RESULT(ResolveFuncTypes(module, errors_));
  CHECK_RESULT(ResolveNamesModule(module, errors_));
  return Result::Ok;
}